

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMesh(CXMeshFileLoader *this,SXMesh *mesh)

{
  bool bVar1;
  short sVar2;
  u32 uVar3;
  u32 uVar4;
  u32 uVar5;
  S3DVertex *pSVar6;
  unsigned_short *puVar7;
  uint *puVar8;
  void *pvVar9;
  ulong uVar10;
  CXMeshFileLoader *pCVar11;
  long in_RSI;
  long in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  double __x_17;
  double __x_18;
  double __x_19;
  double __x_20;
  double __x_21;
  double __x_22;
  u32 j_3;
  u32 size_1;
  u8 *dataptr_1;
  u32 j_2;
  u32 *data_1;
  u32 datasize_1;
  u32 dataformat;
  u8 *dataptr;
  u32 *data;
  u32 datasize;
  u32 index;
  u32 semantics;
  u32 type;
  s16 binormaltype;
  s16 tangenttype;
  s16 uv2type;
  s16 uvtype;
  s16 normaltype;
  s16 binormalpos;
  s16 tangentpos;
  s16 uv2pos;
  s16 uvpos;
  s16 normalpos;
  u16 size;
  u32 dcnt;
  u32 j_1;
  stringc objectName;
  u32 j;
  u32 jk;
  u32 f;
  u32 triangles;
  u32 fcnt;
  u32 k;
  u32 currentIndex;
  array<unsigned_int> polygonfaces;
  u32 nFaces;
  u32 n;
  u32 nVertices;
  stringc name;
  undefined4 in_stack_fffffffffffffce8;
  u32 in_stack_fffffffffffffcec;
  CXMeshFileLoader *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  uint in_stack_fffffffffffffcfc;
  array<irr::core::vector2d<float>_> *in_stack_fffffffffffffd00;
  void *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  CXMeshFileLoader *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  uint uVar12;
  u32 in_stack_fffffffffffffd44;
  u32 in_stack_fffffffffffffd48;
  u32 in_stack_fffffffffffffd4c;
  uint in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  uint in_stack_fffffffffffffd58;
  u32 in_stack_fffffffffffffd5c;
  CXMeshFileLoader *in_stack_fffffffffffffd78;
  SXMesh *in_stack_fffffffffffffd80;
  CXMeshFileLoader *in_stack_fffffffffffffd88;
  uint local_248;
  uint local_234;
  void *local_200;
  u32 in_stack_fffffffffffffe50;
  u32 in_stack_fffffffffffffe54;
  u32 in_stack_fffffffffffffe58;
  u32 in_stack_fffffffffffffe5c;
  short local_19a;
  short local_198;
  short local_196;
  ushort local_190;
  ushort local_18e;
  ushort local_18c;
  ushort local_18a;
  uint local_184;
  SXMesh *in_stack_fffffffffffffe80;
  CXMeshFileLoader *in_stack_fffffffffffffe88;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_c8;
  SXMesh *in_stack_ffffffffffffff70;
  CXMeshFileLoader *in_stack_ffffffffffffff78;
  vector3d<float> local_74;
  SColor local_68;
  uint local_64;
  u32 local_60;
  int local_5c;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  core::string<char>::string((string<char> *)0x2e46d4);
  bVar1 = readHeadOfDataObject
                    ((CXMeshFileLoader *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                     (stringc *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  uVar12 = (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  if (bVar1) {
    local_60 = readInt((CXMeshFileLoader *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    core::array<irr::video::S3DVertex>::set_used
              ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
    for (local_64 = 0; local_64 < local_60; local_64 = local_64 + 1) {
      core::array<irr::video::S3DVertex>::operator[]
                ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec
                );
      readVector3(in_stack_fffffffffffffcf0,
                  (vector3df *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      video::SColor::SColor(&local_68,0xffffffff);
      pSVar6 = core::array<irr::video::S3DVertex>::operator[]
                         ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffcf0,
                          in_stack_fffffffffffffcec);
      (pSVar6->Color).color = local_68.color;
      core::vector3d<float>::vector3d(&local_74,0.0);
      pSVar6 = core::array<irr::video::S3DVertex>::operator[]
                         ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffcf0,
                          in_stack_fffffffffffffcec);
      (pSVar6->Normal).X = local_74.X;
      (pSVar6->Normal).Y = local_74.Y;
      (pSVar6->Normal).Z = local_74.Z;
    }
    bVar1 = checkForTwoFollowingSemicolons(in_stack_fffffffffffffd18);
    if (!bVar1) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Vertex Array found in x file",
                       __x_01);
      core::string<char>::string
                ((string<char> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      core::string<char>::c_str((string<char> *)0x2e48aa);
      os::Printer::log(__x_02);
      core::string<char>::~string((string<char> *)0x2e48cb);
    }
    uVar3 = readInt((CXMeshFileLoader *)
                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    core::array<unsigned_int>::set_used
              ((array<unsigned_int> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
    core::array<unsigned_short>::set_used
              ((array<unsigned_short> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
    core::array<unsigned_int>::array((array<unsigned_int> *)in_stack_fffffffffffffcf0);
    for (local_c8 = 0; local_c8 < uVar3; local_c8 = local_c8 + 1) {
      uVar4 = readInt((CXMeshFileLoader *)
                      CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      uVar12 = (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20);
      if (uVar4 == 3) {
        in_stack_fffffffffffffd44 =
             readInt((CXMeshFileLoader *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        puVar8 = core::array<unsigned_int>::operator[]
                           ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                            in_stack_fffffffffffffcec);
        *puVar8 = in_stack_fffffffffffffd44;
        in_stack_fffffffffffffd48 =
             readInt((CXMeshFileLoader *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        puVar8 = core::array<unsigned_int>::operator[]
                           ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                            in_stack_fffffffffffffcec);
        *puVar8 = in_stack_fffffffffffffd48;
        in_stack_fffffffffffffd4c =
             readInt((CXMeshFileLoader *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        puVar8 = core::array<unsigned_int>::operator[]
                           ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                            in_stack_fffffffffffffcec);
        *puVar8 = in_stack_fffffffffffffd4c;
        puVar7 = core::array<unsigned_short>::operator[]
                           ((array<unsigned_short> *)in_stack_fffffffffffffcf0,
                            in_stack_fffffffffffffcec);
        *puVar7 = 3;
      }
      else {
        if (uVar4 < 3) {
          os::Printer::log((Printer *)"Invalid face count (<3) found in Mesh x file reader.",__x_03)
          ;
          core::string<char>::string
                    ((string<char> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     uVar12);
          core::string<char>::c_str((string<char> *)0x2e49ac);
          os::Printer::log(__x_04);
          core::string<char>::~string((string<char> *)0x2e49cd);
          *(undefined1 *)(in_RDI + 0x50) = 1;
          local_1 = 0;
          local_5c = 1;
          goto LAB_002e5c80;
        }
        core::array<unsigned_int>::set_used
                  ((array<unsigned_int> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        core::array<unsigned_int>::size((array<unsigned_int> *)0x2e4a3d);
        core::array<unsigned_int>::set_used
                  ((array<unsigned_int> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        puVar7 = core::array<unsigned_short>::operator[]
                           ((array<unsigned_short> *)in_stack_fffffffffffffcf0,
                            in_stack_fffffffffffffcec);
        *puVar7 = (short)(uVar4 - 2) * 3;
        for (local_f8 = 0; local_f8 < uVar4; local_f8 = local_f8 + 1) {
          in_stack_fffffffffffffd5c =
               readInt((CXMeshFileLoader *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          *puVar8 = in_stack_fffffffffffffd5c;
        }
        for (local_fc = 0; local_fc < uVar4 - 2; local_fc = local_fc + 1) {
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          in_stack_fffffffffffffd50 = *puVar8;
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          *puVar8 = in_stack_fffffffffffffd50;
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          in_stack_fffffffffffffd54 = *puVar8;
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          *puVar8 = in_stack_fffffffffffffd54;
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          in_stack_fffffffffffffd58 = *puVar8;
          puVar8 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffcf0,
                              in_stack_fffffffffffffcec);
          *puVar8 = in_stack_fffffffffffffd58;
        }
      }
    }
    local_100 = 0;
    while (uVar12 = local_100,
          uVar3 = core::array<unsigned_int>::size((array<unsigned_int> *)0x2e4d0d), uVar12 < uVar3)
    {
      puVar8 = core::array<unsigned_int>::operator[]
                         ((array<unsigned_int> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec
                         );
      in_stack_fffffffffffffd3c = *puVar8;
      uVar3 = core::array<irr::video::S3DVertex>::size((array<irr::video::S3DVertex> *)0x2e4d4d);
      if (uVar3 <= in_stack_fffffffffffffd3c) {
        os::Printer::log((Printer *)"Out of range index found in Mesh x file reader.",__x_05);
        *(undefined1 *)(in_RDI + 0x50) = 1;
        local_1 = 0;
        local_5c = 1;
        goto LAB_002e5c80;
      }
      local_100 = local_100 + 1;
    }
    bVar1 = checkForTwoFollowingSemicolons(in_stack_fffffffffffffd18);
    if (!bVar1) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Face Array found in x file",__x_06
                      );
      core::string<char>::string
                ((string<char> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      core::string<char>::c_str((string<char> *)0x2e4deb);
      os::Printer::log(__x_07);
      core::string<char>::~string((string<char> *)0x2e4e0c);
    }
    do {
      getNextToken(in_stack_fffffffffffffd78);
      uVar3 = core::string<char>::size((string<char> *)0x2e4e32);
      if (uVar3 == 0) {
        os::Printer::log((Printer *)"Unexpected ending found in Mesh in x file.",__x_08);
        core::string<char>::string
                  ((string<char> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        core::string<char>::c_str((string<char> *)0x2e4e6d);
        os::Printer::log(__x_09);
        core::string<char>::~string((string<char> *)0x2e4e8e);
        *(undefined1 *)(in_RDI + 0x50) = 1;
        local_1 = 0;
        local_5c = 1;
      }
      else {
        bVar1 = core::string<char>::operator==
                          ((string<char> *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                           (char *)in_stack_fffffffffffffcf0);
        if (bVar1) {
          local_5c = 0x18;
        }
        else {
          bVar1 = core::string<char>::operator==
                            ((string<char> *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (char *)in_stack_fffffffffffffcf0);
          if (bVar1) {
            bVar1 = parseDataObjectMeshNormals(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
            if (bVar1) goto LAB_002e5c34;
            local_1 = 0;
            local_5c = 1;
          }
          else {
            bVar1 = core::string<char>::operator==
                              ((string<char> *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                               (char *)in_stack_fffffffffffffcf0);
            if (bVar1) {
              bVar1 = parseDataObjectMeshTextureCoords
                                ((CXMeshFileLoader *)
                                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                 (SXMesh *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
              if (bVar1) goto LAB_002e5c34;
              local_1 = 0;
              local_5c = 1;
            }
            else {
              bVar1 = core::string<char>::operator==
                                ((string<char> *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                                 (char *)in_stack_fffffffffffffcf0);
              if (bVar1) {
                bVar1 = parseDataObjectMeshVertexColors
                                  (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
                if (bVar1) goto LAB_002e5c34;
                local_1 = 0;
                local_5c = 1;
              }
              else {
                bVar1 = core::string<char>::operator==
                                  ((string<char> *)
                                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                                   (char *)in_stack_fffffffffffffcf0);
                if (bVar1) {
                  bVar1 = parseDataObjectMeshMaterialList
                                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                  if (bVar1) goto LAB_002e5c34;
                  local_1 = 0;
                  local_5c = 1;
                }
                else {
                  bVar1 = core::string<char>::operator==
                                    ((string<char> *)
                                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                                     (char *)in_stack_fffffffffffffcf0);
                  if (bVar1) {
                    bVar1 = parseUnknownDataObject
                                      ((CXMeshFileLoader *)
                                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                                      );
                    if (bVar1) goto LAB_002e5c34;
                    local_1 = 0;
                    local_5c = 1;
                  }
                  else {
                    bVar1 = core::string<char>::operator==
                                      ((string<char> *)
                                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                       ,(char *)in_stack_fffffffffffffcf0);
                    if (bVar1) {
                      bVar1 = readHeadOfDataObject
                                        ((CXMeshFileLoader *)
                                         CONCAT44(in_stack_fffffffffffffd4c,
                                                  in_stack_fffffffffffffd48),
                                         (stringc *)CONCAT44(in_stack_fffffffffffffd44,uVar12));
                      if (bVar1) {
                        uVar3 = readInt((CXMeshFileLoader *)
                                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
                        local_18a = 0;
                        local_18c = 0xffff;
                        local_18e = 0xffff;
                        local_190 = 0xffff;
                        local_196 = -1;
                        local_198 = -1;
                        local_19a = -1;
                        for (local_184 = 0; local_184 < uVar3; local_184 = local_184 + 1) {
                          in_stack_fffffffffffffe5c =
                               readInt((CXMeshFileLoader *)
                                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      );
                          readInt((CXMeshFileLoader *)
                                  CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                          in_stack_fffffffffffffe58 =
                               readInt((CXMeshFileLoader *)
                                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      );
                          in_stack_fffffffffffffe54 =
                               readInt((CXMeshFileLoader *)
                                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)
                                      );
                          sVar2 = (short)in_stack_fffffffffffffe5c;
                          switch(in_stack_fffffffffffffe58) {
                          case 3:
                            local_18c = local_18a;
                            local_196 = sVar2;
                            break;
                          default:
                            break;
                          case 5:
                            if (in_stack_fffffffffffffe54 == 0) {
                              local_18e = local_18a;
                              local_198 = sVar2;
                            }
                            else if (in_stack_fffffffffffffe54 == 1) {
                              local_190 = local_18a;
                              local_19a = sVar2;
                            }
                            break;
                          case 6:
                            break;
                          case 7:
                          }
                          switch(in_stack_fffffffffffffe5c) {
                          case 0:
                            local_18a = local_18a + 4;
                            break;
                          case 1:
                            local_18a = local_18a + 8;
                            break;
                          case 2:
                            local_18a = local_18a + 0xc;
                            break;
                          case 3:
                            local_18a = local_18a + 0x10;
                            break;
                          case 4:
                          case 5:
                          case 6:
                            local_18a = local_18a + 4;
                            break;
                          case 7:
                            local_18a = local_18a + 8;
                            break;
                          case 8:
                          case 9:
                            local_18a = local_18a + 4;
                            break;
                          case 10:
                            local_18a = local_18a + 8;
                            break;
                          case 0xb:
                            local_18a = local_18a + 4;
                            break;
                          case 0xc:
                            local_18a = local_18a + 8;
                            break;
                          case 0xd:
                            local_18a = local_18a + 4;
                            break;
                          case 0xe:
                            local_18a = local_18a + 4;
                            break;
                          case 0xf:
                            local_18a = local_18a + 4;
                            break;
                          case 0x10:
                            local_18a = local_18a + 8;
                          }
                        }
                        in_stack_fffffffffffffe50 =
                             readInt((CXMeshFileLoader *)
                                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                        uVar10 = SUB168(ZEXT416(in_stack_fffffffffffffe50) * ZEXT816(4),0);
                        if (SUB168(ZEXT416(in_stack_fffffffffffffe50) * ZEXT816(4),8) != 0) {
                          uVar10 = 0xffffffffffffffff;
                        }
                        pvVar9 = operator_new__(uVar10);
                        for (local_184 = 0; local_184 < in_stack_fffffffffffffe50;
                            local_184 = local_184 + 1) {
                          uVar3 = readInt((CXMeshFileLoader *)
                                          CONCAT44(in_stack_fffffffffffffcfc,
                                                   in_stack_fffffffffffffcf8));
                          *(u32 *)((long)pvVar9 + (ulong)local_184 * 4) = uVar3;
                        }
                        bVar1 = checkForOneFollowingSemicolons(in_stack_fffffffffffffd18);
                        if (!bVar1) {
                          os::Printer::log((Printer *)"No finishing semicolon in DeclData found.",
                                           __x_12);
                          core::string<char>::string
                                    ((string<char> *)
                                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                     (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
                          core::string<char>::c_str((string<char> *)0x2e5542);
                          os::Printer::log(__x_13);
                          core::string<char>::~string((string<char> *)0x2e5563);
                        }
                        bVar1 = checkForClosingBrace
                                          ((CXMeshFileLoader *)
                                           CONCAT44(in_stack_fffffffffffffd14,
                                                    in_stack_fffffffffffffd10));
                        if (bVar1) {
                          if ((local_190 != 0xffff) && (local_19a == 1)) {
                            in_stack_fffffffffffffd18 = (CXMeshFileLoader *)(local_18 + 0x90);
                            core::array<irr::video::S3DVertex>::size
                                      ((array<irr::video::S3DVertex> *)0x2e5660);
                            core::array<irr::core::vector2d<float>_>::reallocate
                                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                                       SUB41((uint)in_stack_fffffffffffffcf8 >> 0x18,0));
                          }
                          local_184 = 0;
                          local_200 = pvVar9;
                          while (in_stack_fffffffffffffd14 = local_184,
                                uVar3 = core::array<irr::video::S3DVertex>::size
                                                  ((array<irr::video::S3DVertex> *)0x2e5698),
                                in_stack_fffffffffffffd14 < uVar3) {
                            if ((local_18c != 0xffff) && (local_196 == 2)) {
                              pSVar6 = core::array<irr::video::S3DVertex>::operator[]
                                                 ((array<irr::video::S3DVertex> *)
                                                  in_stack_fffffffffffffcf0,
                                                  in_stack_fffffffffffffcec);
                              core::vector3d<float>::set
                                        (&pSVar6->Normal,
                                         (vector3d<float> *)
                                         ((long)local_200 + (long)(int)(short)local_18c));
                            }
                            if ((local_18e != 0xffff) && (local_198 == 1)) {
                              pSVar6 = core::array<irr::video::S3DVertex>::operator[]
                                                 ((array<irr::video::S3DVertex> *)
                                                  in_stack_fffffffffffffcf0,
                                                  in_stack_fffffffffffffcec);
                              core::vector2d<float>::set
                                        (&pSVar6->TCoords,
                                         (vector2d<float> *)
                                         ((long)local_200 + (long)(int)(short)local_18e));
                            }
                            if ((local_190 != 0xffff) && (local_19a == 1)) {
                              core::array<irr::core::vector2d<float>_>::push_back
                                        ((array<irr::core::vector2d<float>_> *)
                                         in_stack_fffffffffffffcf0,
                                         (vector2d<float> *)
                                         CONCAT44(in_stack_fffffffffffffcec,
                                                  in_stack_fffffffffffffce8));
                            }
                            local_200 = (void *)((long)local_200 + (long)(int)(uint)local_18a);
                            local_184 = local_184 + 1;
                          }
                          in_stack_fffffffffffffd08 = pvVar9;
                          if (pvVar9 != (void *)0x0) {
                            operator_delete__(pvVar9);
                            in_stack_fffffffffffffd08 = pvVar9;
                          }
                          goto LAB_002e5c34;
                        }
                        os::Printer::log((Printer *)"No closing brace in DeclData.",__x_14);
                        core::string<char>::string
                                  ((string<char> *)
                                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                   (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
                        core::string<char>::c_str((string<char> *)0x2e55ae);
                        os::Printer::log(__x_15);
                        core::string<char>::~string((string<char> *)0x2e55cf);
                        if (pvVar9 != (void *)0x0) {
                          operator_delete__(pvVar9);
                        }
                        *(undefined1 *)(in_RDI + 0x50) = 1;
                        local_1 = 0;
                        local_5c = 1;
                      }
                      else {
                        os::Printer::log((Printer *)"No starting brace in DeclData found.",__x_10);
                        core::string<char>::string
                                  ((string<char> *)
                                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                   (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
                        core::string<char>::c_str((string<char> *)0x2e50ce);
                        os::Printer::log(__x_11);
                        core::string<char>::~string((string<char> *)0x2e50ef);
                        *(undefined1 *)(in_RDI + 0x50) = 1;
                        local_1 = 0;
                        local_5c = 1;
                      }
                    }
                    else {
                      bVar1 = core::string<char>::operator==
                                        ((string<char> *)
                                         CONCAT44(in_stack_fffffffffffffcfc,
                                                  in_stack_fffffffffffffcf8),
                                         (char *)in_stack_fffffffffffffcf0);
                      if (bVar1) {
                        bVar1 = readHeadOfDataObject
                                          ((CXMeshFileLoader *)
                                           CONCAT44(in_stack_fffffffffffffd4c,
                                                    in_stack_fffffffffffffd48),
                                           (stringc *)CONCAT44(in_stack_fffffffffffffd44,uVar12));
                        if (bVar1) {
                          uVar3 = readInt((CXMeshFileLoader *)
                                          CONCAT44(in_stack_fffffffffffffcfc,
                                                   in_stack_fffffffffffffcf8));
                          uVar4 = readInt((CXMeshFileLoader *)
                                          CONCAT44(in_stack_fffffffffffffcfc,
                                                   in_stack_fffffffffffffcf8));
                          uVar10 = SUB168(ZEXT416(uVar4) * ZEXT816(4),0);
                          if (SUB168(ZEXT416(uVar4) * ZEXT816(4),8) != 0) {
                            uVar10 = 0xffffffffffffffff;
                          }
                          pCVar11 = (CXMeshFileLoader *)operator_new__(uVar10);
                          for (local_234 = 0; local_234 < uVar4; local_234 = local_234 + 1) {
                            uVar5 = readInt((CXMeshFileLoader *)
                                            CONCAT44(in_stack_fffffffffffffcfc,
                                                     in_stack_fffffffffffffcf8));
                            *(u32 *)((long)&(((_Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                               *)&(pCVar11->super_IMeshLoader)._vptr_IMeshLoader)->
                                            _M_impl).super__Vector_impl_data._M_start +
                                    (ulong)local_234 * 4) = uVar5;
                          }
                          if ((uVar3 & 0x102) != 0) {
                            in_stack_fffffffffffffd00 =
                                 (array<irr::core::vector2d<float>_> *)(local_18 + 0x90);
                            core::array<irr::video::S3DVertex>::size
                                      ((array<irr::video::S3DVertex> *)0x2e5972);
                            core::array<irr::core::vector2d<float>_>::reallocate
                                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                                       SUB41((uint)in_stack_fffffffffffffcf8 >> 0x18,0));
                            local_248 = 0;
                            while (in_stack_fffffffffffffcfc = local_248,
                                  uVar3 = core::array<irr::video::S3DVertex>::size
                                                    ((array<irr::video::S3DVertex> *)0x2e59d4),
                                  in_stack_fffffffffffffcfc < uVar3) {
                              core::array<irr::core::vector2d<float>_>::push_back
                                        ((array<irr::core::vector2d<float>_> *)
                                         in_stack_fffffffffffffcf0,
                                         (vector2d<float> *)
                                         CONCAT44(in_stack_fffffffffffffcec,
                                                  in_stack_fffffffffffffce8));
                              local_248 = local_248 + 1;
                            }
                          }
                          in_stack_fffffffffffffcf0 = pCVar11;
                          if (pCVar11 != (CXMeshFileLoader *)0x0) {
                            operator_delete__(pCVar11);
                            in_stack_fffffffffffffcf0 = pCVar11;
                          }
                          bVar1 = checkForOneFollowingSemicolons(in_stack_fffffffffffffd18);
                          if (!bVar1) {
                            os::Printer::log((Printer *)"No finishing semicolon in FVFData found.",
                                             __x_18);
                            core::string<char>::string
                                      ((string<char> *)
                                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)
                                       ,(uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
                            core::string<char>::c_str((string<char> *)0x2e5a8f);
                            os::Printer::log(__x_19);
                            core::string<char>::~string((string<char> *)0x2e5ab0);
                          }
                          bVar1 = checkForClosingBrace
                                            ((CXMeshFileLoader *)
                                             CONCAT44(in_stack_fffffffffffffd14,
                                                      in_stack_fffffffffffffd10));
                          if (bVar1) goto LAB_002e5c34;
                          os::Printer::log((Printer *)"No closing brace in FVFData found in x file",
                                           __x_20);
                          core::string<char>::string
                                    ((string<char> *)
                                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                     (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
                          core::string<char>::c_str((string<char> *)0x2e5af7);
                          os::Printer::log(__x_21);
                          core::string<char>::~string((string<char> *)0x2e5b18);
                          *(undefined1 *)(in_RDI + 0x50) = 1;
                          local_1 = 0;
                          local_5c = 1;
                        }
                        else {
                          os::Printer::log((Printer *)"No starting brace in FVFData found.",__x_16);
                          core::string<char>::string
                                    ((string<char> *)
                                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                     (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
                          core::string<char>::c_str((string<char> *)0x2e584d);
                          os::Printer::log(__x_17);
                          core::string<char>::~string((string<char> *)0x2e586e);
                          *(undefined1 *)(in_RDI + 0x50) = 1;
                          local_1 = 0;
                          local_5c = 1;
                        }
                      }
                      else {
                        bVar1 = core::string<char>::operator==
                                          ((string<char> *)
                                           CONCAT44(in_stack_fffffffffffffcfc,
                                                    in_stack_fffffffffffffcf8),
                                           (char *)in_stack_fffffffffffffcf0);
                        if (bVar1) {
                          bVar1 = parseDataObjectSkinMeshHeader
                                            ((CXMeshFileLoader *)
                                             CONCAT44(in_stack_fffffffffffffd5c,
                                                      in_stack_fffffffffffffd58),
                                             (SXMesh *)
                                             CONCAT44(in_stack_fffffffffffffd54,
                                                      in_stack_fffffffffffffd50));
                          if (bVar1) goto LAB_002e5c34;
                          local_1 = 0;
                          local_5c = 1;
                        }
                        else {
                          bVar1 = core::string<char>::operator==
                                            ((string<char> *)
                                             CONCAT44(in_stack_fffffffffffffcfc,
                                                      in_stack_fffffffffffffcf8),
                                             (char *)in_stack_fffffffffffffcf0);
                          if (bVar1) {
                            bVar1 = parseDataObjectSkinWeights
                                              ((CXMeshFileLoader *)
                                               CONCAT44(in_stack_fffffffffffffe5c,
                                                        in_stack_fffffffffffffe58),
                                               (SXMesh *)
                                               CONCAT44(in_stack_fffffffffffffe54,
                                                        in_stack_fffffffffffffe50));
                            if (bVar1) goto LAB_002e5c34;
                            local_1 = 0;
                            local_5c = 1;
                          }
                          else {
                            core::string<char>::c_str((string<char> *)0x2e5be8);
                            os::Printer::log(__x_22);
                            bVar1 = parseUnknownDataObject
                                              ((CXMeshFileLoader *)
                                               CONCAT44(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38));
                            if (bVar1) {
LAB_002e5c34:
                              local_5c = 0;
                            }
                            else {
                              local_1 = 0;
                              local_5c = 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      core::string<char>::~string((string<char> *)0x2e5c4c);
      if (local_5c != 0) goto LAB_002e5c5d;
      in_stack_fffffffffffffcec = 0;
    } while( true );
  }
  os::Printer::log((Printer *)"No opening brace in Mesh found in x file",__x);
  core::string<char>::string
            ((string<char> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),uVar12);
  core::string<char>::c_str((string<char> *)0x2e4723);
  os::Printer::log(__x_00);
  core::string<char>::~string((string<char> *)0x2e4744);
  *(undefined1 *)(in_RDI + 0x50) = 1;
  local_1 = 0;
  local_5c = 1;
LAB_002e5c8d:
  core::string<char>::~string((string<char> *)0x2e5c9a);
  return (bool)(local_1 & 1);
LAB_002e5c5d:
  if (local_5c == 0x18) {
    local_1 = 1;
    local_5c = 1;
  }
LAB_002e5c80:
  core::array<unsigned_int>::~array((array<unsigned_int> *)0x2e5c8d);
  goto LAB_002e5c8d;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMesh(SXMesh &mesh)
{
	core::stringc name;

	if (!readHeadOfDataObject(&name)) {
#ifdef _XREADER_DEBUG
		os::Printer::log("CXFileReader: Reading mesh", ELL_DEBUG);
#endif
		os::Printer::log("No opening brace in Mesh found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: Reading mesh", name.c_str(), ELL_DEBUG);
#endif

	// read vertex count
	const u32 nVertices = readInt();

	// read vertices
	mesh.Vertices.set_used(nVertices);
	for (u32 n = 0; n < nVertices; ++n) {
		readVector3(mesh.Vertices[n].Pos);
		mesh.Vertices[n].Color = 0xFFFFFFFF;
		mesh.Vertices[n].Normal = core::vector3df(0.0f);
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// read faces
	const u32 nFaces = readInt();

	mesh.Indices.set_used(nFaces * 3);
	mesh.IndexCountPerFace.set_used(nFaces);

	core::array<u32> polygonfaces;
	u32 currentIndex = 0;

	for (u32 k = 0; k < nFaces; ++k) {
		const u32 fcnt = readInt();

		if (fcnt != 3) {
			if (fcnt < 3) {
				os::Printer::log("Invalid face count (<3) found in Mesh x file reader.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read face indices
			polygonfaces.set_used(fcnt);
			u32 triangles = (fcnt - 2);
			mesh.Indices.set_used(mesh.Indices.size() + ((triangles - 1) * 3));
			mesh.IndexCountPerFace[k] = (u16)(triangles * 3);

			for (u32 f = 0; f < fcnt; ++f)
				polygonfaces[f] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Indices[currentIndex++] = polygonfaces[0];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 1];
				mesh.Indices[currentIndex++] = polygonfaces[jk + 2];
			}

			// TODO: change face indices in material list
		} else {
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.Indices[currentIndex++] = readInt();
			mesh.IndexCountPerFace[k] = 3;
		}
	}

	for (u32 j = 0; j < mesh.Indices.size(); j++) {
		if (mesh.Indices[j] >= mesh.Vertices.size()) {
			os::Printer::log("Out of range index found in Mesh x file reader.", ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	// here, other data objects may follow

	while (true) {
		core::stringc objectName = getNextToken();

		if (objectName.size() == 0) {
			os::Printer::log("Unexpected ending found in Mesh in x file.", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		} else if (objectName == "}") {
			break; // mesh finished
		}

#ifdef _XREADER_DEBUG
		os::Printer::log("debug DataObject in mesh", objectName.c_str(), ELL_DEBUG);
#endif

		if (objectName == "MeshNormals") {
			if (!parseDataObjectMeshNormals(mesh))
				return false;
		} else if (objectName == "MeshTextureCoords") {
			if (!parseDataObjectMeshTextureCoords(mesh))
				return false;
		} else if (objectName == "MeshVertexColors") {
			if (!parseDataObjectMeshVertexColors(mesh))
				return false;
		} else if (objectName == "MeshMaterialList") {
			if (!parseDataObjectMeshMaterialList(mesh))
				return false;
		} else if (objectName == "VertexDuplicationIndices") {
			// we'll ignore vertex duplication indices
			// TODO: read them
			if (!parseUnknownDataObject())
				return false;
		} else if (objectName == "DeclData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			// arbitrary vertex attributes
			// first comes the number of element definitions
			// then the vertex element type definitions
			// with format type;tesselator;semantics;usageindex
			// we want to support 2;0;6;0 == tangent
			//                    2;0;7;0 == binormal
			//                    2;0;3;0 == normal
			//                  1/2;0;5;0 == 1st uv coord
			// and              1/2;0;5;1 == 2nd uv coord
			// type==2 is 3xf32, type==1 is 2xf32
			u32 j;
			const u32 dcnt = readInt();
			u16 size = 0;
			s16 normalpos = -1;
			s16 uvpos = -1;
			s16 uv2pos = -1;
			s16 tangentpos = -1;
			s16 binormalpos = -1;
			s16 normaltype = -1;
			s16 uvtype = -1;
			s16 uv2type = -1;
			s16 tangenttype = -1;
			s16 binormaltype = -1;

			(void)tangentpos;   // disable unused variable warnings
			(void)binormalpos;  // disable unused variable warnings
			(void)tangenttype;  // disable unused variable warnings
			(void)binormaltype; // disable unused variable warnings

			for (j = 0; j < dcnt; ++j) {
				const u32 type = readInt();
				// const u32 tesselator = readInt();
				readInt();
				const u32 semantics = readInt();
				const u32 index = readInt();
				switch (semantics) {
				case 3:
					normalpos = size;
					normaltype = type;
					break;
				case 5:
					if (index == 0) {
						uvpos = size;
						uvtype = type;
					} else if (index == 1) {
						uv2pos = size;
						uv2type = type;
					}
					break;
				case 6:
					tangentpos = size;
					tangenttype = type;
					break;
				case 7:
					binormalpos = size;
					binormaltype = type;
					break;
				default:
					break;
				}
				switch (type) {
				case 0:
					size += 4;
					break;
				case 1:
					size += 8;
					break;
				case 2:
					size += 12;
					break;
				case 3:
					size += 16;
					break;
				case 4:
				case 5:
				case 6:
					size += 4;
					break;
				case 7:
					size += 8;
					break;
				case 8:
				case 9:
					size += 4;
					break;
				case 10:
					size += 8;
					break;
				case 11:
					size += 4;
					break;
				case 12:
					size += 8;
					break;
				case 13:
					size += 4;
					break;
				case 14:
					size += 4;
					break;
				case 15:
					size += 4;
					break;
				case 16:
					size += 8;
					break;
				}
			}
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (j = 0; j < datasize; ++j)
				data[j] = readInt();

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in DeclData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in DeclData.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				delete[] data;
				SET_ERR_AND_RETURN();
			}
			u8 *dataptr = (u8 *)data;
			if ((uv2pos != -1) && (uv2type == 1))
				mesh.TCoords2.reallocate(mesh.Vertices.size());
			for (j = 0; j < mesh.Vertices.size(); ++j) {
				if ((normalpos != -1) && (normaltype == 2))
					mesh.Vertices[j].Normal.set(*((core::vector3df *)(dataptr + normalpos)));
				if ((uvpos != -1) && (uvtype == 1))
					mesh.Vertices[j].TCoords.set(*((core::vector2df *)(dataptr + uvpos)));
				if ((uv2pos != -1) && (uv2type == 1))
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr + uv2pos)));
				dataptr += size;
			}
			delete[] data;
		} else if (objectName == "FVFData") {
			if (!readHeadOfDataObject()) {
				os::Printer::log("No starting brace in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
			const u32 dataformat = readInt();
			const u32 datasize = readInt();
			u32 *data = new u32[datasize];
			for (u32 j = 0; j < datasize; ++j)
				data[j] = readInt();
			if (dataformat & 0x102) { // 2nd uv set
				mesh.TCoords2.reallocate(mesh.Vertices.size());
				u8 *dataptr = (u8 *)data;
				const u32 size = ((dataformat >> 8) & 0xf) * sizeof(core::vector2df);
				for (u32 j = 0; j < mesh.Vertices.size(); ++j) {
					mesh.TCoords2.push_back(*((core::vector2df *)(dataptr)));
					dataptr += size;
				}
			}
			delete[] data;
			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon in FVFData found.", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}
			if (!checkForClosingBrace()) {
				os::Printer::log("No closing brace in FVFData found in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}
		} else if (objectName == "XSkinMeshHeader") {
			if (!parseDataObjectSkinMeshHeader(mesh))
				return false;
		} else if (objectName == "SkinWeights") {
			// mesh.SkinWeights.push_back(SXSkinWeight());
			// if (!parseDataObjectSkinWeights(mesh.SkinWeights.getLast()))
			if (!parseDataObjectSkinWeights(mesh))
				return false;
		} else {
			os::Printer::log("Unknown data object in mesh in x file", objectName.c_str(), ELL_WARNING);
			if (!parseUnknownDataObject())
				return false;
		}
	}

	return true;
}